

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s.hpp
# Opt level: O2

void __thiscall
estl::
sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
::sort(sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
       *this)

{
  pointer pvVar1;
  
  pvVar1 = (this->data_vec_).data_ptr_;
  std::
  __sort<std::pair<std::__cxx11::string,std::__cxx11::string>*,__gnu_cxx::__ops::_Iter_comp_iter<estl::sort_map_s<std::__cxx11::string,std::__cxx11::string,30ul,std::less<std::__cxx11::string>,10ul>::comperator>>
            (pvVar1,pvVar1 + (this->data_vec_).size_);
  this->is_sorted_ = true;
  return;
}

Assistant:

void sort()
    {
        std::sort(data_vec_.begin(), data_vec_.end(), comperator_);
        is_sorted_ = true;
    }